

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_connection_reconfigure(PacketProtocolLayer *ppl,Conf *conf)

{
  Conf *pCVar1;
  ssh2_connection_state *s;
  Conf *conf_local;
  PacketProtocolLayer *ppl_local;
  
  conf_free((Conf *)ppl[-2].selfptr);
  pCVar1 = conf_copy(conf);
  ppl[-2].selfptr = (PacketProtocolLayer **)pCVar1;
  if (((ulong)ppl[-1].bpp & 1) != 0) {
    portfwdmgr_config((PortFwdManager *)ppl[-1].vt,(Conf *)ppl[-2].selfptr);
  }
  return;
}

Assistant:

static void ssh2_connection_reconfigure(PacketProtocolLayer *ppl, Conf *conf)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);

    conf_free(s->conf);
    s->conf = conf_copy(conf);

    if (s->portfwdmgr_configured)
        portfwdmgr_config(s->portfwdmgr, s->conf);
}